

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

int proxy_open(proxy_handle *ph)

{
  long *result;
  long lVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  regex_handle *prVar6;
  char *pcVar7;
  long lVar8;
  mutex_handle *mutex;
  char *pcVar9;
  long lVar10;
  size_t __nmemb;
  ulong uVar11;
  
  plVar2 = (long *)ph->priv;
  result = plVar2 + 0x112;
  conn_port_to_str((ph->conf).port,(char *)result);
  __nmemb = (ulong)(ph->conf).bind_addr_ext_add_len + 1;
  *(int *)(plVar2 + 0x107) = (int)__nmemb;
  pvVar5 = calloc(__nmemb,0x48);
  *plVar2 = (long)pvVar5;
  if (pvVar5 == (void *)0x0) {
    return -0xc;
  }
  pvVar5 = calloc(__nmemb,0x50);
  plVar2[0x103] = (long)pvVar5;
  iVar4 = -0xc;
  iVar3 = iVar4;
  if ((pvVar5 == (void *)0x0) || (iVar3 = log_open((log_handle *)(plVar2 + 0x10c)), iVar3 < 0))
  goto LAB_0010470a;
  pcVar9 = (ph->conf).calls_allowed;
  prVar6 = (regex_handle *)plVar2[0x105];
  if (pcVar9 == (char *)0x0) {
    if (prVar6 != (regex_handle *)0x0) {
      regex_free(prVar6);
      free((void *)plVar2[0x105]);
      plVar2[0x105] = 0;
    }
LAB_001043ad:
    pcVar9 = (ph->conf).calls_denied;
    prVar6 = (regex_handle *)plVar2[0x106];
    if (pcVar9 == (char *)0x0) {
      if (prVar6 != (regex_handle *)0x0) {
        regex_free(prVar6);
        free((void *)plVar2[0x106]);
        plVar2[0x106] = 0;
      }
    }
    else {
      if (prVar6 == (regex_handle *)0x0) {
        prVar6 = (regex_handle *)calloc(1,8);
        plVar2[0x106] = (long)prVar6;
        iVar3 = iVar4;
        if (prVar6 == (regex_handle *)0x0) goto LAB_0010470a;
        iVar3 = regex_init(prVar6);
        if (iVar3 < 0) {
          pcVar9 = "Failed to initialize denied callsigns regex (%d): %s\n";
          goto LAB_001046e7;
        }
        prVar6 = (regex_handle *)plVar2[0x106];
        pcVar9 = (ph->conf).calls_denied;
      }
      iVar3 = regex_compile(prVar6,pcVar9);
      if (iVar3 < 0) {
        pcVar9 = "Failed to compile denied callsigns regex (%d): %s\n";
        goto LAB_001046e7;
      }
    }
    memset(plVar2 + 3,0,0x800);
    lVar8 = *plVar2;
    *(char **)(lVar8 + 0x10) = (ph->conf).bind_addr_ext;
    *(long **)(lVar8 + 0x30) = plVar2 + 1;
    plVar2[1] = lVar8;
    iVar4 = (int)plVar2[0x107];
    for (lVar10 = 1; lVar10 < iVar4; lVar10 = lVar10 + 1) {
      *(char **)(lVar8 + 0x58) = (ph->conf).bind_addr_ext_add[lVar10 + -1];
      *(undefined8 *)(lVar8 + 0x80) = 0;
      *(undefined8 *)(lVar8 + 0x88) = 0;
      *(long *)(lVar8 + 0x28) = lVar8 + 0x48;
      *(long *)(lVar8 + 0x78) = lVar8 + 0x28;
      lVar8 = lVar8 + 0x48;
    }
    *(undefined8 *)(lVar8 + 0x28) = 0;
    plVar2[2] = lVar8 + 0x28;
    lVar8 = 0;
    for (uVar11 = 0; (long)uVar11 < (long)iVar4; uVar11 = uVar11 + 1) {
      lVar10 = *plVar2;
      *(char **)(lVar10 + 0x18 + lVar8) = "5199";
      *(char **)(lVar10 + 0x20 + lVar8) = "5198";
      *(proxy_handle **)(lVar10 + 8 + lVar8) = ph;
      iVar3 = proxy_conn_init((proxy_conn_handle *)(lVar10 + lVar8));
      if (iVar3 < 0) {
        pcVar9 = strerror(-iVar3);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy connection #%d (%d): %s\n",
                  uVar11 & 0xffffffff,(ulong)(uint)-iVar3,pcVar9);
        for (; lVar8 = lVar8 + -0x48, 0 < (long)uVar11; uVar11 = uVar11 - 1) {
          proxy_conn_free((proxy_conn_handle *)(*plVar2 + lVar8));
        }
        goto LAB_0010470a;
      }
      iVar4 = (int)plVar2[0x107];
      lVar8 = lVar8 + 0x48;
    }
    lVar8 = 0;
    for (uVar11 = 0; (long)uVar11 < (long)iVar4; uVar11 = uVar11 + 1) {
      lVar10 = plVar2[0x103];
      mutex = (mutex_handle *)((undefined8 *)(lVar10 + lVar8) + 3);
      *(undefined8 *)(lVar10 + lVar8) = ph;
      iVar3 = mutex_init(mutex);
      if (iVar3 < 0) {
LAB_0010468a:
        pcVar9 = strerror(-iVar3);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy client worker #%d (%d): %s\n",
                  uVar11 & 0xffffffff,(ulong)(uint)-iVar3,pcVar9);
        for (; lVar8 = lVar8 + -0x50, 0 < (long)uVar11; uVar11 = uVar11 - 1) {
          proxy_worker_free((proxy_worker *)(plVar2[0x103] + lVar8));
        }
        goto LAB_001047de;
      }
      lVar1 = lVar10 + lVar8;
      *(long *)(lVar1 + 0x30) = lVar10 + lVar8;
      *(code **)(lVar1 + 0x28) = proxy_worker_func;
      *(undefined4 *)(lVar1 + 0x38) = 0x100000;
      iVar3 = worker_init((worker_handle *)(lVar1 + 0x20));
      if (iVar3 < 0) {
        mutex_free(mutex);
        goto LAB_0010468a;
      }
      lVar10 = plVar2[0x103];
      *(long *)(lVar10 + 0x10 + lVar8) = plVar2[0x104];
      plVar2[0x104] = lVar10 + lVar8;
      iVar4 = (int)plVar2[0x107];
      lVar8 = lVar8 + 0x50;
    }
    plVar2[0x109] = (long)(ph->conf).bind_addr;
    plVar2[0x10a] = (long)result;
    iVar3 = conn_listen((conn_handle *)(plVar2 + 0x108));
    if (-1 < iVar3) {
      pcVar9 = (ph->conf).bind_addr;
      if (pcVar9 != (char *)0x0) {
        proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections at %s:%s\n",pcVar9,result);
        return 0;
      }
      proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections on port %s\n",result);
      return 0;
    }
    pcVar9 = strerror(-iVar3);
    lVar10 = 0;
    proxy_log(ph,LOG_LEVEL_FATAL,"Failed to open listening port (%d): %s\n",(ulong)(uint)-iVar3,
              pcVar9);
    plVar2[0x104] = 0;
    for (lVar8 = 0; lVar8 < (int)plVar2[0x107]; lVar8 = lVar8 + 1) {
      proxy_worker_free((proxy_worker *)(plVar2[0x103] + lVar10));
      lVar10 = lVar10 + 0x50;
    }
LAB_001047de:
    plVar2[1] = 0;
    plVar2[2] = 0;
    lVar8 = 0;
    for (lVar10 = 0; lVar10 < (int)plVar2[0x107]; lVar10 = lVar10 + 1) {
      proxy_conn_free((proxy_conn_handle *)(*plVar2 + lVar8));
      lVar8 = lVar8 + 0x48;
    }
  }
  else {
    if (prVar6 == (regex_handle *)0x0) {
      prVar6 = (regex_handle *)calloc(1,8);
      plVar2[0x105] = (long)prVar6;
      iVar3 = iVar4;
      if (prVar6 == (regex_handle *)0x0) goto LAB_0010470a;
      iVar3 = regex_init(prVar6);
      if (-1 < iVar3) {
        prVar6 = (regex_handle *)plVar2[0x105];
        pcVar9 = (ph->conf).calls_allowed;
        goto LAB_0010436b;
      }
      pcVar9 = "Failed to initialize allowed callsigns regex (%d): %s\n";
    }
    else {
LAB_0010436b:
      iVar3 = regex_compile(prVar6,pcVar9);
      if (-1 < iVar3) goto LAB_001043ad;
      pcVar9 = "Failed to compile allowed callsigns regex (%d): %s\n";
    }
LAB_001046e7:
    pcVar7 = strerror(-iVar3);
    proxy_log(ph,LOG_LEVEL_FATAL,pcVar9,(ulong)(uint)-iVar3,pcVar7);
  }
LAB_0010470a:
  if ((regex_handle *)plVar2[0x105] != (regex_handle *)0x0) {
    regex_free((regex_handle *)plVar2[0x105]);
    free((void *)plVar2[0x105]);
    plVar2[0x105] = 0;
  }
  log_close((log_handle *)(plVar2 + 0x10c));
  free((void *)plVar2[0x103]);
  plVar2[0x103] = 0;
  free((void *)*plVar2);
  *plVar2 = 0;
  *(undefined4 *)(plVar2 + 0x107) = 0;
  return iVar3;
}

Assistant:

int proxy_open(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;
	int ret;

	conn_port_to_str(ph->conf.port, priv->port_str);

	priv->num_clients = 1 + ph->conf.bind_addr_ext_add_len;

	priv->clients = calloc(priv->num_clients, sizeof(*priv->clients));
	if (priv->clients == NULL)
		return -ENOMEM;

	priv->client_workers = calloc(priv->num_clients,
				      sizeof(struct proxy_worker));
	if (priv->client_workers == NULL) {
		ret = -ENOMEM;
		goto proxy_open_exit;
	}

	ret = log_open(&priv->log);
	if (ret < 0)
		goto proxy_open_exit;

	if (ph->conf.calls_allowed != NULL) {
		if (priv->re_calls_allowed == NULL) {
			priv->re_calls_allowed = calloc(1,
				sizeof(*priv->re_calls_allowed));
			if (priv->re_calls_allowed == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_allowed);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize allowed callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_allowed,
				    ph->conf.calls_allowed);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile allowed callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	if (ph->conf.calls_denied != NULL) {
		if (priv->re_calls_denied == NULL) {
			priv->re_calls_denied = calloc(1,
				sizeof(*priv->re_calls_denied));
			if (priv->re_calls_denied == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_denied);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize denied callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_denied,
				    ph->conf.calls_denied);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile denied callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_denied != NULL) {
		regex_free(priv->re_calls_denied);
		free(priv->re_calls_denied);
		priv->re_calls_denied = NULL;
	}

	memset(priv->clients_by_call, 0x0, sizeof(priv->clients_by_call));

	priv->clients[0].source_addr = ph->conf.bind_addr_ext;

	priv->clients[0].prev_ptr = &priv->idle_clients_head;
	priv->idle_clients_head = &priv->clients[0];

	for (i = 1; i < priv->num_clients; i++) {
		priv->clients[i].source_addr = ph->conf.bind_addr_ext_add[i - 1];
		priv->clients[i].prev_by_call_ptr = NULL;
		priv->clients[i].next_by_call = NULL;
		priv->clients[i - 1].next = &priv->clients[i];
		priv->clients[i].prev_ptr = &priv->clients[i - 1].next;
	}

	priv->clients[i - 1].next = NULL;
	priv->idle_clients_tail_ptr = &priv->clients[i - 1].next;

	for (i = 0; i < priv->num_clients; i++) {
		priv->clients[i].control_port = "5199";
		priv->clients[i].data_port = "5198";
		priv->clients[i].ph = ph;
		ret = proxy_conn_init(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_conn_free(&priv->clients[i]);

			goto proxy_open_exit;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		priv->client_workers[i].ph = ph;
		ret = proxy_worker_init(&priv->client_workers[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy client worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_worker_free(&priv->client_workers[i]);

			goto proxy_open_exit_late;
		}

		priv->client_workers[i].next = priv->idle_workers_head;
		priv->idle_workers_head = &priv->client_workers[i];
	}

	priv->conn_listen.source_addr = (const char *)ph->conf.bind_addr;
	priv->conn_listen.source_port = (const char *)priv->port_str;

	ret = conn_listen(&priv->conn_listen);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to open listening port (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_open_exit_later;
	}

	if (ph->conf.bind_addr == NULL)
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections on port %s\n",
			  priv->port_str);
	else
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections at %s:%s\n",
			  ph->conf.bind_addr,
			  priv->port_str);

	return 0;

proxy_open_exit_later:
	priv->idle_workers_head = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_free(&priv->client_workers[i]);

proxy_open_exit_late:
	priv->idle_clients_head = NULL;
	priv->idle_clients_tail_ptr = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_conn_free(&priv->clients[i]);

proxy_open_exit:
	if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	log_close(&priv->log);

	free(priv->client_workers);
	priv->client_workers = NULL;

	free(priv->clients);
	priv->clients = NULL;

	priv->num_clients = 0;

	return ret;
}